

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

parse_dynamic_spec_result<char>
fmt::v11::detail::parse_dynamic_spec<char>
          (char *begin,char *end,int *value,arg_ref<char> *ref,parse_context<char> *ctx)

{
  int iVar1;
  parse_dynamic_spec_result<char> pVar2;
  arg_id_kind kind;
  arg_id_kind local_34;
  char *local_30;
  dynamic_spec_handler<char> local_28;
  
  local_34 = none;
  local_30 = begin;
  if ((byte)(*begin - 0x30U) < 10) {
    iVar1 = parse_nonnegative_int<char>(&local_30,end,-1);
    if (iVar1 == -1) {
      report_error("number is too big");
    }
    *value = iVar1;
LAB_0022fa7e:
    pVar2.kind = local_34;
    pVar2.end = local_30;
    pVar2._12_4_ = 0;
    return pVar2;
  }
  if (*begin == '{') {
    local_30 = begin + 1;
    if (local_30 != end) {
      if ((*local_30 == '}') || (*local_30 == ':')) {
        iVar1 = ctx->next_arg_id_;
        if (iVar1 < 0) {
          report_error("cannot switch from manual to automatic argument indexing");
        }
        ctx->next_arg_id_ = iVar1 + 1;
        ref->index = iVar1;
        local_34 = index;
      }
      else {
        local_28.kind = &local_34;
        local_28.ctx = ctx;
        local_28.ref = ref;
        local_30 = parse_arg_id<char,fmt::v11::detail::dynamic_spec_handler<char>>
                             (local_30,end,&local_28);
      }
    }
    if ((local_30 != end) && (*local_30 == '}')) {
      local_30 = local_30 + 1;
      goto LAB_0022fa7e;
    }
  }
  report_error("invalid format string");
}

Assistant:

FMT_CONSTEXPR auto parse_dynamic_spec(const Char* begin, const Char* end,
                                      int& value, arg_ref<Char>& ref,
                                      parse_context<Char>& ctx)
    -> parse_dynamic_spec_result<Char> {
  FMT_ASSERT(begin != end, "");
  auto kind = arg_id_kind::none;
  if ('0' <= *begin && *begin <= '9') {
    int val = parse_nonnegative_int(begin, end, -1);
    if (val == -1) report_error("number is too big");
    value = val;
  } else {
    if (*begin == '{') {
      ++begin;
      if (begin != end) {
        Char c = *begin;
        if (c == '}' || c == ':') {
          int id = ctx.next_arg_id();
          ref = id;
          kind = arg_id_kind::index;
          ctx.check_dynamic_spec(id);
        } else {
          begin = parse_arg_id(begin, end,
                               dynamic_spec_handler<Char>{ctx, ref, kind});
        }
      }
      if (begin != end && *begin == '}') return {++begin, kind};
    }
    report_error("invalid format string");
  }
  return {begin, kind};
}